

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounds_checks.h
# Opt level: O2

void * snmalloc::report_fatal_bounds_error<void*>(void *ptr,size_t len,char *msg)

{
  void *args_5;
  void *args_4;
  void *p;
  
  args_5 = external_pointer<(snmalloc::Boundary)2,_snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                     (ptr);
  args_4 = external_pointer<(snmalloc::Boundary)0,_snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                     (ptr);
  report_fatal_error<1024ul,char_const*,char_const*,void*,void*,void*,void*,unsigned_long>
            ("Fatal Error!\n{}: \n\trange [{}, {})\n\tallocation [{}, {})\nrange goes beyond allocation by {} bytes \n"
             ,msg,ptr,(void *)(len + (long)ptr),args_4,args_5,(long)(len + (long)ptr) - (long)args_5
            );
}

Assistant:

SNMALLOC_SLOW_PATH SNMALLOC_UNUSED_FUNCTION inline FakeReturn
  report_fatal_bounds_error(const void* ptr, size_t len, const char* msg)
  {
    if constexpr (FailFast)
    {
      UNUSED(ptr, len, msg);
      SNMALLOC_FAST_FAIL();
    }
    else
    {
      void* p = const_cast<void*>(ptr);

      auto range_end = pointer_offset(p, len);
      auto object_end = external_pointer<OnePastEnd>(p);
      report_fatal_error(
        "Fatal Error!\n{}: \n\trange [{}, {})\n\tallocation [{}, "
        "{})\nrange goes beyond allocation by {} bytes \n",
        msg,
        p,
        range_end,
        external_pointer<Start>(p),
        object_end,
        pointer_diff(object_end, range_end));
    }
  }